

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

Terminator * __thiscall soul::Optimisations::Inliner::cloneTerminator(Inliner *this,Terminator *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *in_R8;
  undefined1 auVar3 [16];
  Terminator *pTVar2;
  
  iVar1 = 0;
  auVar3 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::Branch::typeinfo);
  if (auVar3._0_8_ == (__fn *)0x0) {
    iVar1 = 0;
    auVar3 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::BranchIf::typeinfo);
    if (auVar3._0_8_ == (__fn *)0x0) {
      iVar1 = 0;
      auVar3 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnVoid::typeinfo);
      if (auVar3._0_8_ == (__fn *)0x0) {
        iVar1 = 0;
        auVar3 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnValue::typeinfo);
        if (auVar3._0_8_ == (__fn *)0x0) {
          throwInternalCompilerError("cloneTerminator",0x26a);
        }
        iVar1 = clone(this,auVar3._0_8_,auVar3._8_8_,iVar1,in_R8);
        pTVar2 = (Terminator *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        iVar1 = clone(this,auVar3._0_8_,auVar3._8_8_,iVar1,in_R8);
        pTVar2 = (Terminator *)CONCAT44(extraout_var_01,iVar1);
      }
    }
    else {
      iVar1 = clone(this,auVar3._0_8_,auVar3._8_8_,iVar1,in_R8);
      pTVar2 = (Terminator *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    iVar1 = clone(this,auVar3._0_8_,auVar3._8_8_,iVar1,in_R8);
    pTVar2 = (Terminator *)CONCAT44(extraout_var,iVar1);
  }
  return pTVar2;
}

Assistant:

heart::Terminator& cloneTerminator (heart::Terminator& s)
        {
            #define SOUL_CLONE_TERMINATOR(Type)    if (auto t = cast<const heart::Type> (s)) return clone (*t);
            SOUL_HEART_TERMINATORS (SOUL_CLONE_TERMINATOR)
            #undef SOUL_CLONE_TERMINATOR
            SOUL_ASSERT_FALSE;
            return s;
        }